

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

ErrCode __thiscall Regex::dumpTree(Regex *this,string *dump)

{
  bool bVar1;
  Element *pEStack_28;
  bool done;
  Element *cur_node;
  string *dump_local;
  Regex *this_local;
  
  if ((this->mState == STATE_PARSED) || (this->mState == STATE_PREPARED)) {
    pEStack_28 = &this->mRoot;
    while (pEStack_28 != (Element *)0x0) {
      dumpElement(this,pEStack_28,dump);
      if (pEStack_28->mChild == (Element *)0x0) {
        if (pEStack_28->mNext == (Element *)0x0) {
          bVar1 = false;
          while (!bVar1) {
            if (pEStack_28->mParent == (Element *)0x0) {
              bVar1 = true;
              pEStack_28 = (Element *)0x0;
            }
            else {
              pEStack_28 = pEStack_28->mParent;
              if (pEStack_28->mNext != (Element *)0x0) {
                pEStack_28 = pEStack_28->mNext;
                bVar1 = true;
              }
            }
          }
        }
        else {
          pEStack_28 = pEStack_28->mNext;
        }
      }
      else {
        pEStack_28 = pEStack_28->mChild;
      }
    }
    this_local._4_4_ = kNoError;
  }
  else {
    this_local._4_4_ = kNotInitialized;
  }
  return this_local._4_4_;
}

Assistant:

JetHead::ErrCode	Regex::dumpTree( std::string &dump )
{
	if ( mState != Regex::STATE_PARSED && mState != Regex::STATE_PREPARED )
		return JetHead::kNotInitialized;

	Element *cur_node = &mRoot;
	
	while( cur_node != NULL )
	{
		dumpElement( cur_node, dump );
		
		if ( cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( cur_node->mParent == NULL )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return JetHead::kNoError;
}